

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O2

SampleBuilder * __thiscall tcu::SampleBuilder::operator<<(SampleBuilder *this,double v)

{
  Value local_18;
  
  local_18.type = TYPE_FLOAT64;
  local_18.value.float64 = v;
  std::vector<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>::
  emplace_back<tcu::SampleBuilder::Value>(&this->m_values,&local_18);
  return this;
}

Assistant:

SampleBuilder&			operator<<			(double v)	{ m_values.push_back(Value(v));				return *this; }